

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
toml::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,value_t t)

{
  value_t t_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  switch(t) {
  case empty:
    std::operator<<(os,"empty");
    break;
  case boolean:
    std::operator<<(os,"boolean");
    break;
  case integer:
    std::operator<<(os,"integer");
    break;
  case floating:
    std::operator<<(os,"floating");
    break;
  case string:
    std::operator<<(os,"string");
    break;
  case offset_datetime:
    std::operator<<(os,"offset_datetime");
    break;
  case local_datetime:
    std::operator<<(os,"local_datetime");
    break;
  case local_date:
    std::operator<<(os,"local_date");
    break;
  case local_time:
    std::operator<<(os,"local_time");
    break;
  case array:
    std::operator<<(os,"array");
    break;
  case table:
    std::operator<<(os,"table");
    break;
  default:
    std::operator<<(os,"unknown");
  }
  return os;
}

Assistant:

inline std::basic_ostream<charT, traits>&
operator<<(std::basic_ostream<charT, traits>& os, value_t t)
{
    switch(t)
    {
        case value_t::boolean         : os << "boolean";         return os;
        case value_t::integer         : os << "integer";         return os;
        case value_t::floating        : os << "floating";        return os;
        case value_t::string          : os << "string";          return os;
        case value_t::offset_datetime : os << "offset_datetime"; return os;
        case value_t::local_datetime  : os << "local_datetime";  return os;
        case value_t::local_date      : os << "local_date";      return os;
        case value_t::local_time      : os << "local_time";      return os;
        case value_t::array           : os << "array";           return os;
        case value_t::table           : os << "table";           return os;
        case value_t::empty           : os << "empty";           return os;
        default                       : os << "unknown";         return os;
    }
}